

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

int luaG_getfuncline(Proto *f,int pc)

{
  AbsLineInfo *pAVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  
  if (f->lineinfo == (ls_byte *)0x0) {
    return -1;
  }
  uVar5 = f->sizeabslineinfo;
  if ((uVar5 == 0) || (pAVar1 = f->abslineinfo, pc < pAVar1->pc)) {
    piVar8 = &f->linedefined;
    iVar6 = -1;
  }
  else {
    uVar2 = (uint)pc >> 7;
    if ((int)uVar5 <= (int)uVar2) {
      uVar5 = uVar2;
    }
    lVar7 = (ulong)uVar2 - 2;
    do {
      lVar9 = (ulong)(uVar5 - uVar2) + (ulong)uVar2 + -1;
      if ((int)lVar7 - uVar5 == -2) break;
      lVar9 = lVar7 + 1;
      lVar3 = lVar7 + 2;
      lVar7 = lVar9;
    } while (pAVar1[lVar3].pc <= pc);
    piVar8 = &pAVar1[(int)lVar9].line;
    iVar6 = pAVar1[(int)lVar9].pc;
  }
  iVar4 = *piVar8;
  if (iVar6 < pc) {
    lVar7 = (long)iVar6;
    do {
      lVar9 = lVar7 + 1;
      lVar7 = lVar7 + 1;
      iVar4 = iVar4 + f->lineinfo[lVar9];
    } while (pc != lVar7);
  }
  return iVar4;
}

Assistant:

int luaG_getfuncline (const Proto *f, int pc) {
  if (f->lineinfo == NULL)  /* no debug information? */
    return -1;
  else {
    int basepc;
    int baseline = getbaseline(f, pc, &basepc);
    while (basepc++ < pc) {  /* walk until given instruction */
      lua_assert(f->lineinfo[basepc] != ABSLINEINFO);
      baseline += f->lineinfo[basepc];  /* correct line */
    }
    return baseline;
  }
}